

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relation.hpp
# Opt level: O0

void __thiscall
duckdb::Relation::Relation
          (Relation *this,shared_ptr<duckdb::RelationContextWrapper,_true> *context,
          RelationType type,string *alias_p)

{
  undefined1 in_DL;
  undefined8 *in_RDI;
  RelationType in_stack_0000004f;
  shared_ptr<duckdb::RelationContextWrapper,_true> *in_stack_ffffffffffffffb8;
  
  enable_shared_from_this<duckdb::Relation>::enable_shared_from_this
            ((enable_shared_from_this<duckdb::Relation> *)0x196396c);
  *in_RDI = &PTR__Relation_0350cc60;
  shared_ptr<duckdb::ClientContextWrapper,_true>::shared_ptr<duckdb::RelationContextWrapper,_0>
            ((shared_ptr<duckdb::ClientContextWrapper,_true> *)(in_RDI + 3),
             in_stack_ffffffffffffffb8);
  *(undefined1 *)(in_RDI + 5) = in_DL;
  CreateRelationAlias(in_stack_0000004f,(string *)this);
  vector<duckdb::shared_ptr<duckdb::ExternalDependency,_true>,_true>::vector
            ((vector<duckdb::shared_ptr<duckdb::ExternalDependency,_true>,_true> *)0x19639c1);
  return;
}

Assistant:

Relation(const shared_ptr<RelationContextWrapper> &context, RelationType type, const string &alias_p = "")
	    : context(context), type(type), alias(CreateRelationAlias(type, alias_p)) {
	}